

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsdMan.c
# Opt level: O1

Dsd_Manager_t * Dsd_ManagerStart(DdManager *dd,int nSuppMax,int fVerbose)

{
  DdNode *pDVar1;
  Dsd_Manager_t *pDVar2;
  Dsd_Node_t **ppDVar3;
  st__table *table;
  Dsd_Node_t *pDVar4;
  ulong uVar5;
  
  if (nSuppMax <= dd->size) {
    pDVar2 = (Dsd_Manager_t *)malloc(0x40);
    pDVar2->dd = (DdManager *)0x0;
    pDVar2->Table = (st__table *)0x0;
    pDVar2->nInputs = 0;
    pDVar2->nRoots = 0;
    *(undefined8 *)&pDVar2->nRootsAlloc = 0;
    pDVar2->pConst1 = (Dsd_Node_t *)0x0;
    *(undefined8 *)&pDVar2->fVerbose = 0;
    pDVar2->pInputs = (Dsd_Node_t **)0x0;
    pDVar2->pRoots = (Dsd_Node_t **)0x0;
    pDVar2->dd = dd;
    pDVar2->nInputs = nSuppMax;
    pDVar2->fVerbose = fVerbose;
    pDVar2->nRoots = 0;
    pDVar2->nRootsAlloc = 0x32;
    ppDVar3 = (Dsd_Node_t **)malloc(400);
    pDVar2->pRoots = ppDVar3;
    ppDVar3 = (Dsd_Node_t **)malloc((long)nSuppMax * 8);
    pDVar2->pInputs = ppDVar3;
    table = st__init_table(st__ptrcmp,st__ptrhash);
    pDVar2->Table = table;
    if (0 < nSuppMax) {
      uVar5 = 0;
      do {
        pDVar4 = Dsd_TreeNodeCreate(2,1,0);
        pDVar1 = dd->vars[uVar5];
        pDVar4->G = pDVar1;
        Cudd_Ref(pDVar1);
        pDVar1 = dd->vars[uVar5];
        pDVar4->S = pDVar1;
        Cudd_Ref(pDVar1);
        st__insert(table,(char *)dd->vars[uVar5],(char *)pDVar4);
        ppDVar3[uVar5] = pDVar4;
        uVar5 = uVar5 + 1;
      } while ((uint)nSuppMax != uVar5);
    }
    pDVar4 = Dsd_TreeNodeCreate(1,0,0);
    pDVar1 = dd->one;
    pDVar4->G = pDVar1;
    Cudd_Ref(pDVar1);
    pDVar1 = dd->one;
    pDVar4->S = pDVar1;
    Cudd_Ref(pDVar1);
    st__insert(table,(char *)dd->one,(char *)pDVar4);
    pDVar2->pConst1 = pDVar4;
    Dsd_CheckCacheAllocate(5000);
    return pDVar2;
  }
  __assert_fail("nSuppMax <= dd->size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/dsd/dsdMan.c"
                ,0x35,"Dsd_Manager_t *Dsd_ManagerStart(DdManager *, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                    FUNCTION DECLARATIONS                         ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                       API OF DSD MANAGER                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the DSD manager.]

  Description [Takes the started BDD manager and the maximum support size
  of the function to be DSD-decomposed. The manager should have at least as
  many variables as there are variables in the support. The functions should 
  be expressed using the first nSuppSizeMax variables in the manager (these
  may be ordered not necessarily on top of the manager).]
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Dsd_Manager_t * Dsd_ManagerStart( DdManager * dd, int nSuppMax, int fVerbose )
{
    Dsd_Manager_t * dMan;
    Dsd_Node_t * pNode;
    int i;

    assert( nSuppMax <= dd->size );

    dMan = ABC_ALLOC( Dsd_Manager_t, 1 );
    memset( dMan, 0, sizeof(Dsd_Manager_t) );
    dMan->dd          = dd;
    dMan->nInputs     = nSuppMax;
    dMan->fVerbose    = fVerbose;
    dMan->nRoots      = 0;
    dMan->nRootsAlloc = 50;
    dMan->pRoots      = (Dsd_Node_t **) ABC_ALLOC( char, dMan->nRootsAlloc * sizeof(Dsd_Node_t *) );
    dMan->pInputs     = (Dsd_Node_t **) ABC_ALLOC( char, dMan->nInputs     * sizeof(Dsd_Node_t *) );

    // create the primary inputs and insert them into the table
    dMan->Table       = st__init_table( st__ptrcmp, st__ptrhash);
    for ( i = 0; i < dMan->nInputs; i++ )
    {
        pNode = Dsd_TreeNodeCreate( DSD_NODE_BUF, 1, 0 );
        pNode->G = dd->vars[i];  Cudd_Ref( pNode->G );
        pNode->S = dd->vars[i];  Cudd_Ref( pNode->S );
        st__insert( dMan->Table, (char*)dd->vars[i], (char*)pNode );
        dMan->pInputs[i] = pNode;
    }
    pNode = Dsd_TreeNodeCreate( DSD_NODE_CONST1, 0, 0 );
    pNode->G = b1;  Cudd_Ref( pNode->G );
    pNode->S = b1;  Cudd_Ref( pNode->S );
    st__insert( dMan->Table, (char*)b1, (char*)pNode );
    dMan->pConst1 = pNode;

    Dsd_CheckCacheAllocate( 5000 );
    return dMan;
}